

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

uint64_t helper_float_rsqrt1_d_mips64(CPUMIPSState_conflict5 *env,uint64_t fdt0)

{
  float_status *s;
  float64 fVar1;
  uintptr_t unaff_retaddr;
  
  s = &(env->active_fpu).fp_status;
  fVar1 = float64_sqrt_mips64(fdt0,s);
  fVar1 = float64_div_mips64(0x3ff0000000000000,fVar1,s);
  update_fcr31(env,unaff_retaddr);
  return fVar1;
}

Assistant:

uint64_t helper_float_rsqrt1_d(CPUMIPSState *env, uint64_t fdt0)
{
    uint64_t fdt2;

    fdt2 = float64_sqrt(fdt0, &env->active_fpu.fp_status);
    fdt2 = float64_div(float64_one, fdt2, &env->active_fpu.fp_status);
    update_fcr31(env, GETPC());
    return fdt2;
}